

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_restr(lysp_yang_ctx *ctx,ly_stmt restr_kw,lysp_restr *restr)

{
  LY_ERR LVar1;
  char *pcVar2;
  char *pcVar3;
  ly_ctx *local_b8;
  ly_ctx *local_a0;
  char *local_98;
  ly_ctx *local_88;
  ly_ctx *local_80;
  ly_ctx *local_70;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_stmt lStack_4c;
  ly_bool __loop_end;
  LY_ERR ret__;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_restr *plStack_28;
  LY_ERR ret;
  lysp_restr *restr_local;
  lysp_yang_ctx *plStack_18;
  ly_stmt restr_kw_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  plStack_28 = restr;
  restr_local._4_4_ = restr_kw;
  plStack_18 = ctx;
  LVar1 = get_argument(ctx,Y_STR_ARG,&(restr->arg).flags,(char **)&word_len,&word,(size_t *)&ret__);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if (_ret__ == 0) {
    if (plStack_18 == (lysp_yang_ctx *)0x0) {
      local_70 = (ly_ctx *)0x0;
    }
    else {
      local_70 = (ly_ctx *)
                 **(undefined8 **)
                   (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
    }
    pcVar2 = lyplg_ext_stmt2str(restr_local._4_4_);
    ly_log(local_70,LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.",pcVar2
          );
  }
  if (word == (char *)0x0) {
    if (plStack_18 == (lysp_yang_ctx *)0x0) {
      local_88 = (ly_ctx *)0x0;
    }
    else {
      local_88 = (ly_ctx *)
                 **(undefined8 **)
                   (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
    }
    if (_ret__ == 0) {
      local_98 = "";
    }
    else {
      local_98 = (char *)word_len;
    }
    buf._4_4_ = lydict_insert(local_88,local_98,_ret__,(char **)plStack_28);
  }
  else {
    if (plStack_18 == (lysp_yang_ctx *)0x0) {
      local_80 = (ly_ctx *)0x0;
    }
    else {
      local_80 = (ly_ctx *)
                 **(undefined8 **)
                   (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
    }
    buf._4_4_ = lydict_insert_zc(local_80,(char *)word_len,(char **)plStack_28);
  }
  if (buf._4_4_ == LY_SUCCESS) {
    buf._4_4_ = 0;
    (plStack_28->arg).mod =
         (lysp_module *)
         (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
    buf._4_4_ = get_keyword(plStack_18,&stack0xffffffffffffffb4,(char **)&word_len,(size_t *)&ret__)
    ;
    if (buf._4_4_ == LY_SUCCESS) {
      if (lStack_4c == LY_STMT_SYNTAX_SEMICOLON) {
        ret___2._3_1_ = 1;
        LVar1 = buf._4_4_;
      }
      else {
        if (lStack_4c != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (plStack_18 == (lysp_yang_ctx *)0x0) {
            local_a0 = (ly_ctx *)0x0;
          }
          else {
            local_a0 = (ly_ctx *)
                       **(undefined8 **)
                         (plStack_18->parsed_mods->field_2).dnodes
                         [plStack_18->parsed_mods->count - 1];
          }
          pcVar2 = lyplg_ext_stmt2str(lStack_4c);
          ly_vlog(local_a0,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar2);
          return LY_EVALID;
        }
        LVar1 = get_keyword(plStack_18,&stack0xffffffffffffffb4,(char **)&word_len,(size_t *)&ret__)
        ;
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        ret___2._3_1_ = lStack_4c == LY_STMT_SYNTAX_RIGHT_BRACE;
        LVar1 = LY_SUCCESS;
      }
      while (buf._4_4_ = LVar1, !(bool)ret___2._3_1_) {
        if (lStack_4c == LY_STMT_DESCRIPTION) {
          LVar1 = parse_text_field(plStack_18,plStack_28->dsc,LY_STMT_DESCRIPTION,0,&plStack_28->dsc
                                   ,Y_STR_ARG,(uint16_t *)0x0,&plStack_28->exts);
        }
        else if (lStack_4c == LY_STMT_ERROR_APP_TAG) {
          LVar1 = parse_text_field(plStack_18,plStack_28,LY_STMT_ERROR_APP_TAG,0,
                                   &plStack_28->eapptag,Y_STR_ARG,(uint16_t *)0x0,&plStack_28->exts)
          ;
        }
        else if (lStack_4c == LY_STMT_ERROR_MESSAGE) {
          LVar1 = parse_text_field(plStack_18,plStack_28,LY_STMT_ERROR_MESSAGE,0,&plStack_28->emsg,
                                   Y_STR_ARG,(uint16_t *)0x0,&plStack_28->exts);
        }
        else if (lStack_4c == LY_STMT_EXTENSION_INSTANCE) {
          LVar1 = parse_ext(plStack_18,(char *)word_len,_ret__,plStack_28,restr_local._4_4_,0,
                            &plStack_28->exts);
        }
        else {
          if (lStack_4c != LY_STMT_REFERENCE) {
            if (plStack_18 == (lysp_yang_ctx *)0x0) {
              local_b8 = (ly_ctx *)0x0;
            }
            else {
              local_b8 = (ly_ctx *)
                         **(undefined8 **)
                           (plStack_18->parsed_mods->field_2).dnodes
                           [plStack_18->parsed_mods->count - 1];
            }
            pcVar2 = lyplg_ext_stmt2str(lStack_4c);
            pcVar3 = lyplg_ext_stmt2str(restr_local._4_4_);
            ly_vlog(local_b8,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar2,pcVar3);
            return LY_EVALID;
          }
          LVar1 = parse_text_field(plStack_18,plStack_28->ref,LY_STMT_REFERENCE,0,&plStack_28->ref,
                                   Y_STR_ARG,(uint16_t *)0x0,&plStack_28->exts);
        }
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        buf._4_4_ = get_keyword(plStack_18,&stack0xffffffffffffffb4,(char **)&word_len,
                                (size_t *)&ret__);
        if (buf._4_4_ != LY_SUCCESS) {
          return buf._4_4_;
        }
        LVar1 = LY_SUCCESS;
        if (lStack_4c == LY_STMT_SYNTAX_RIGHT_BRACE) {
          if ((plStack_28->exts != (lysp_ext_instance *)0x0) &&
             (LVar1 = ly_set_add(&plStack_18->main_ctx->ext_inst,plStack_28->exts,'\x01',
                                 (uint32_t *)0x0), LVar1 != LY_SUCCESS)) {
            return LVar1;
          }
          buf._4_4_ = LVar1;
          ret___2._3_1_ = true;
          LVar1 = buf._4_4_;
        }
      }
    }
  }
  return buf._4_4_;
}

Assistant:

static LY_ERR
parse_restr(struct lysp_yang_ctx *ctx, enum ly_stmt restr_kw, struct lysp_restr *restr)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, &restr->arg.flags, &word, &buf, &word_len));

    CHECK_NONEMPTY(ctx, word_len, lyplg_ext_stmt2str(restr_kw));
    INSERT_WORD_GOTO(ctx, buf, restr->arg.str, word, word_len, ret, cleanup);
    restr->arg.mod = PARSER_CUR_PMOD(ctx);
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, restr->dsc, LY_STMT_DESCRIPTION, 0, &restr->dsc, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, restr->ref, LY_STMT_REFERENCE, 0, &restr->ref, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_ERROR_APP_TAG:
            LY_CHECK_RET(parse_text_field(ctx, restr, LY_STMT_ERROR_APP_TAG, 0, &restr->eapptag, Y_STR_ARG, NULL,
                    &restr->exts));
            break;
        case LY_STMT_ERROR_MESSAGE:
            LY_CHECK_RET(parse_text_field(ctx, restr, LY_STMT_ERROR_MESSAGE, 0, &restr->emsg, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, restr, restr_kw, 0, &restr->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(restr_kw));
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, restr->exts, ret, cleanup);
    }

cleanup:
    return ret;
}